

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_utilities.c
# Opt level: O2

size_t check_file(FILE *fh,size_t buffer_size,char delim,size_t fields,int *widths)

{
  uint uVar1;
  char *__s;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  size_t local_58;
  
  __s = (char *)malloc(buffer_size);
  rewind((FILE *)fh);
  local_58 = 0;
  do {
    do {
      pcVar2 = fgets(__s,(int)buffer_size,(FILE *)fh);
      if (pcVar2 == (char *)0x0) {
        rewind((FILE *)fh);
        free(__s);
        return local_58;
      }
      local_58 = local_58 + 1;
      sVar3 = strlen(__s);
      if (__s[sVar3 - 1] != '\n') {
        pcVar2 = "Line %zu will not fit into a %zu-character buffer.\n";
        fields = buffer_size;
        goto LAB_00101e22;
      }
      pcVar2 = strchr(__s,0x23);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
      }
      sVar3 = strlen(__s);
    } while (sVar3 < 2);
    pcVar2 = next_token(__s,delim);
    for (lVar4 = 1; lVar4 - fields != 1; lVar4 = lVar4 + 1) {
      if (pcVar2 == (char *)0x0) {
        fprintf(_stderr,"Line %zu contains less than %zu fields.\n",local_58,fields);
LAB_00101de2:
        rewind((FILE *)fh);
        goto LAB_00101df1;
      }
      uVar1 = widths[lVar4 + -1];
      if ((-1 < (long)(int)uVar1) && (sVar3 = strlen(pcVar2), (ulong)(long)(int)uVar1 <= sVar3)) {
        fprintf(_stderr,"Line %zu: Field %zu \'%s\' will not fit in a %d character string.\n",
                local_58,lVar4,pcVar2,(ulong)uVar1);
        goto LAB_00101de2;
      }
      pcVar2 = next_token((char *)0x0,delim);
    }
  } while (pcVar2 == (char *)0x0);
  pcVar2 = "Line %zu contains more than %zu fields.\n";
LAB_00101e22:
  fprintf(_stderr,pcVar2,local_58,fields);
  rewind((FILE *)fh);
LAB_00101df1:
  free(__s);
  return 0xffffffffffffffff;
}

Assistant:

size_t check_file( FILE * fh, size_t buffer_size, char delim, size_t fields, int const * widths )
{
    /* Dynamically allocated buffer */
    char * buffer = malloc( buffer_size );
    size_t lines = 0;

    rewind( fh );

    while ( fgets( buffer, buffer_size, fh ) )
    {
        size_t i;
        char * p;

        ++lines;

        /* Check line for complete read */
        if ( buffer[ strlen( buffer ) - 1 ] != '\n' )
        {
            fprintf( stderr, "Line %zu will not fit into a %zu-character buffer.\n", lines, buffer_size );
            rewind( fh );
            free( buffer );
            return -1;
        }

        /* Remove comments */
        if ( ( p = strchr( buffer, '#' ) ) != NULL )
        {
            *p = '\0';
        }

        /* > 1 because of newline */
        if ( strlen( buffer ) > 1 )
        {
            /* Check field count and field widths */
            p = next_token( buffer, delim );

            for ( i = 0; i < fields; ++i )
            {
                if ( ! p )
                {
                    fprintf( stderr, "Line %zu contains less than %zu fields.\n", lines, fields );
                    rewind( fh );
                    free( buffer );
                    return -1;
                }

                if ( widths[ i ] >= 0 && strlen( p ) >= ( unsigned )widths[ i ] )
                {
                    fprintf( stderr, "Line %zu: Field %zu '%s' will not fit in a %d character string.\n", lines, i + 1, p, widths[ i ] );
                    rewind( fh );
                    free( buffer );
                    return -1;
                }

                p = next_token( NULL, delim );
            }

            if ( p )
            {
                fprintf( stderr, "Line %zu contains more than %zu fields.\n", lines, fields );
                rewind( fh );
                free( buffer );
                return -1;
            }
        }
    }

    /* Rewind, free the buffer, and report the number of lines */
    rewind( fh );
    free( buffer );
    return lines;
}